

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

int ncnn::binary_op_no_broadcast<ncnn::binary_op_pow>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong extraout_RAX;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  ulong uVar15;
  float fVar16;
  ulong uVar10;
  
  iVar8 = a->c;
  lVar9 = (long)iVar8;
  if (0 < lVar9) {
    uVar7 = a->h * a->w * a->d;
    uVar10 = (ulong)uVar7;
    pvVar14 = a->data;
    sVar1 = a->cstep;
    pvVar12 = b->data;
    sVar2 = b->cstep;
    pvVar11 = c->data;
    sVar3 = c->cstep;
    sVar4 = c->elemsize;
    sVar5 = b->elemsize;
    sVar6 = a->elemsize;
    lVar13 = 0;
    do {
      if (0 < (int)uVar7) {
        uVar15 = 0;
        do {
          fVar16 = powf(*(float *)((long)pvVar14 + uVar15 * 4),
                        *(float *)((long)pvVar12 + uVar15 * 4));
          *(float *)((long)pvVar11 + uVar15 * 4) = fVar16;
          uVar15 = uVar15 + 1;
          uVar10 = extraout_RAX;
        } while (uVar7 != uVar15);
      }
      iVar8 = (int)uVar10;
      lVar13 = lVar13 + 1;
      pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
      pvVar12 = (void *)((long)pvVar12 + sVar2 * sVar5);
      pvVar14 = (void *)((long)pvVar14 + sVar1 * sVar6);
    } while (lVar13 != lVar9);
  }
  return iVar8;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int channels = a.c;
    int size = a.w * a.h * a.d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = op(ptr[i], ptr1[i]);
        }
    }

    return 0;
}